

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_wcscmp(char16_t *string1,char16_t *string2)

{
  int iVar1;
  int ret;
  char16_t *string2_local;
  char16_t *string1_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = PAL_wcsncmp(string1,string2,0x7fffffff);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return iVar1;
  }
  abort();
}

Assistant:

int
__cdecl
PAL_wcscmp(
        const char16_t *string1,
        const char16_t *string2)
{
    int ret;

    PERF_ENTRY(wcscmp);
    ENTRY("wcscmp (string1=%p (%S), string2=%p (%S))\n",
          string1?string1:W16_NULLSTRING,
          string1?string1:W16_NULLSTRING, string2?string2:W16_NULLSTRING, string2?string2:W16_NULLSTRING);

    ret = PAL_wcsncmp(string1, string2, 0x7fffffff);

    LOGEXIT("wcscmp returns int %d\n", ret);
    PERF_EXIT(wcscmp);
    return ret;
}